

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void set_done(vw *all)

{
  parser *ppVar1;
  
  all->early_terminate = true;
  ppVar1 = all->p;
  ppVar1->done = true;
  (ppVar1->ready_parsed_examples).done = true;
  std::condition_variable::notify_all();
  std::condition_variable::notify_all();
  return;
}

Assistant:

void set_done(vw& all)
{
  all.early_terminate = true;
  lock_done(*all.p);
}